

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O3

bool protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set
               (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,int32_t key,
               protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *val,upb_Arena *a)

{
  _Bool _Var1;
  upb_Map *puVar2;
  upb_MiniTableField field;
  int32_t local_44;
  upb_MiniTableField local_40;
  
  local_40.number_dont_copy_me__upb_internal_use_only = 0x67;
  local_40.offset_dont_copy_me__upb_internal_use_only = 0x370;
  local_40.presence = 0;
  local_40.submsg_index_dont_copy_me__upb_internal_use_only = 0x18;
  local_40.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  local_40.mode_dont_copy_me__upb_internal_use_only = 0xc0;
  local_44 = key;
  puVar2 = _upb_Message_GetOrCreateMutableMap
                     (&msg->base_dont_copy_me__upb_internal_use_only,&local_40,4,8,a);
  if (puVar2->is_frozen_dont_copy_me__upb_internal_use_only != true) {
    if (puVar2->is_strtable_dont_copy_me__upb_internal_use_only == true) {
      upb_strtable_remove2(&(puVar2->t).strtable,(char *)&local_44,4,(upb_value *)0x0);
      _Var1 = upb_strtable_insert(&(puVar2->t).strtable,(char *)&local_44,4,(upb_value)val,a);
    }
    else {
      upb_inttable_remove(&(puVar2->t).inttable,(ulong)(uint)key,(upb_value *)0x0);
      _Var1 = upb_inttable_insert(&(puVar2->t).inttable,(ulong)(uint)key,(upb_value)val,a);
    }
    return _Var1 != false;
  }
  __assert_fail("!upb_Map_IsFrozen(map)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/map.h"
                ,0xb0,
                "upb_MapInsertStatus _upb_Map_Insert(struct upb_Map *, const void *, size_t, void *, size_t, upb_Arena *)"
               );
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto2_TestAllTypesProto2_map_int32_nested_message_set(protobuf_test_messages_proto2_TestAllTypesProto2* msg, int32_t key, protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* val, upb_Arena* a) {
  const upb_MiniTableField field = {103, UPB_SIZE(336, 880), 0, 24, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__MapInt32NestedMessageEntry_msg_init);
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, sizeof(key), sizeof(val), a);
  return _upb_Map_Insert(map, &key, sizeof(key), &val, sizeof(val), a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}